

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void spr_write_excp_vector(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 t0;
  int sprn_offs;
  TCGContext_conflict10 *tcg_ctx;
  int gprn_local;
  int sprn_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((sprn < 400) || (0x19f < sprn)) {
    if ((sprn < 0x210) || (0x215 < sprn)) {
      if ((sprn < 0x1b0) || (0x1b4 < sprn)) {
        printf("Trying to write an unknown exception vector %d %03x\n",(ulong)(uint)sprn,
               (ulong)(uint)sprn);
        gen_inval_exception(ctx,2);
        return;
      }
      t0._4_4_ = sprn + -0x18a;
    }
    else {
      t0._4_4_ = sprn + -0x1f0;
    }
  }
  else {
    t0._4_4_ = sprn + -400;
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_ld_i64_ppc64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x132f0);
  tcg_gen_and_i64_ppc64(tcg_ctx_00,ret,ret,cpu_gpr[gprn]);
  tcg_gen_st_i64_ppc64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(long)t0._4_4_ * 8 + 0x12fb8);
  gen_store_spr(tcg_ctx_00,sprn,ret);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void spr_write_excp_vector(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sprn_offs;

    if (sprn >= SPR_BOOKE_IVOR0 && sprn <= SPR_BOOKE_IVOR15) {
        sprn_offs = sprn - SPR_BOOKE_IVOR0;
    } else if (sprn >= SPR_BOOKE_IVOR32 && sprn <= SPR_BOOKE_IVOR37) {
        sprn_offs = sprn - SPR_BOOKE_IVOR32 + 32;
    } else if (sprn >= SPR_BOOKE_IVOR38 && sprn <= SPR_BOOKE_IVOR42) {
        sprn_offs = sprn - SPR_BOOKE_IVOR38 + 38;
    } else {
        printf("Trying to write an unknown exception vector %d %03x\n",
               sprn, sprn);
        gen_inval_exception(ctx, POWERPC_EXCP_PRIV_REG);
        return;
    }

    TCGv t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_ld_tl(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, ivor_mask));
    tcg_gen_and_tl(tcg_ctx, t0, t0, cpu_gpr[gprn]);
    tcg_gen_st_tl(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, excp_vectors[sprn_offs]));
    gen_store_spr(tcg_ctx, sprn, t0);
    tcg_temp_free(tcg_ctx, t0);
}